

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

LineTable * __thiscall llvm::DWARFContext::getLineTableForUnit(DWARFContext *this,DWARFUnit *U)

{
  bool bVar1;
  reference ppLVar2;
  Expected<const_llvm::DWARFDebugLine::LineTable_*> local_68;
  function<void_(llvm::Error)> local_50;
  undefined1 local_30 [8];
  Expected<const_llvm::DWARFDebugLine::LineTable_*> ExpectedLineTable;
  DWARFUnit *U_local;
  DWARFContext *this_local;
  
  ExpectedLineTable._8_8_ = U;
  std::function<void(llvm::Error)>::function<void(&)(llvm::Error),void>
            ((function<void(llvm::Error)> *)&local_50,dumpWarning);
  getLineTableForUnit((DWARFContext *)local_30,(DWARFUnit *)this,(function<void_(llvm::Error)> *)U);
  std::function<void_(llvm::Error)>::~function(&local_50);
  bVar1 = llvm::Expected::operator_cast_to_bool((Expected *)local_30);
  if (bVar1) {
    ppLVar2 = Expected<const_llvm::DWARFDebugLine::LineTable_*>::operator*
                        ((Expected<const_llvm::DWARFDebugLine::LineTable_*> *)local_30);
    this_local = (DWARFContext *)*ppLVar2;
  }
  else {
    Expected<const_llvm::DWARFDebugLine::LineTable_*>::takeError(&local_68);
    dumpWarning((Error *)&local_68);
    Error::~Error((Error *)&local_68);
    this_local = (DWARFContext *)0x0;
  }
  Expected<const_llvm::DWARFDebugLine::LineTable_*>::~Expected
            ((Expected<const_llvm::DWARFDebugLine::LineTable_*> *)local_30);
  return (LineTable *)this_local;
}

Assistant:

const DWARFDebugLine::LineTable *
DWARFContext::getLineTableForUnit(DWARFUnit *U) {
  Expected<const DWARFDebugLine::LineTable *> ExpectedLineTable =
      getLineTableForUnit(U, dumpWarning);
  if (!ExpectedLineTable) {
    dumpWarning(ExpectedLineTable.takeError());
    return nullptr;
  }
  return *ExpectedLineTable;
}